

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsystemtrayicon.cpp
# Opt level: O3

void QSystemTrayIcon::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  QArrayData *pQVar5;
  code *pcVar6;
  long lVar7;
  QIcon QVar8;
  undefined1 visible;
  MessageIcon msgIcon;
  QIcon *pQVar9;
  QString *pQVar10;
  QString *pQVar11;
  QSystemTrayIconPrivate *pQVar12;
  int iVar13;
  long in_FS_OFFSET;
  QIcon local_30;
  QIcon local_28;
  QIcon *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_30.d._0_4_ = *_a[1];
      goto LAB_0038ac07;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QMetaObject::activate(_o,&staticMetaObject,1,(void **)0x0);
        return;
      }
      goto LAB_0038ac5d;
    case 2:
      visible = *_a[1];
LAB_0038aac1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_0038aad8:
        setVisible((QSystemTrayIcon *)_o,(bool)visible);
        return;
      }
      goto LAB_0038ac5d;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_0038ac5d;
      visible = true;
      goto LAB_0038aad8;
    case 4:
      pQVar12 = *(QSystemTrayIconPrivate **)(_o + 8);
      if (pQVar12->visible != false) {
        pQVar12->visible = false;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QSystemTrayIconPrivate::remove_sys(pQVar12);
          return;
        }
        goto LAB_0038ac5d;
      }
      break;
    case 5:
      pQVar12 = *(QSystemTrayIconPrivate **)(_o + 8);
      if (pQVar12->visible == true) {
        iVar13 = *_a[4];
        pQVar9 = (QIcon *)_a[3];
        pQVar11 = (QString *)_a[1];
        pQVar10 = (QString *)_a[2];
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_0038abd6:
          QSystemTrayIconPrivate::showMessage_sys(pQVar12,pQVar11,pQVar10,pQVar9,NoIcon,iVar13);
          return;
        }
        goto LAB_0038ac5d;
      }
      break;
    case 6:
      pQVar12 = *(QSystemTrayIconPrivate **)(_o + 8);
      if (pQVar12->visible == true) {
        pQVar9 = (QIcon *)_a[3];
        pQVar11 = (QString *)_a[1];
        pQVar10 = (QString *)_a[2];
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          iVar13 = 10000;
          goto LAB_0038abd6;
        }
        goto LAB_0038ac5d;
      }
      break;
    case 7:
      pQVar11 = (QString *)_a[1];
      pQVar10 = (QString *)_a[2];
      msgIcon = *_a[3];
      iVar13 = *_a[4];
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_0038ac5d;
      goto LAB_0038ac51;
    case 8:
      pQVar11 = (QString *)_a[1];
      pQVar10 = (QString *)_a[2];
      msgIcon = *_a[3];
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_0038ac5d;
      goto LAB_0038ac4b;
    case 9:
      pQVar11 = (QString *)_a[1];
      pQVar10 = (QString *)_a[2];
      if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_0038ac5d;
      msgIcon = Information;
LAB_0038ac4b:
      iVar13 = 10000;
LAB_0038ac51:
      showMessage((QSystemTrayIcon *)_o,pQVar11,pQVar10,msgIcon,iVar13);
      return;
    case 10:
      local_30.d._0_4_ = *_a[1];
      _o = *(QObject **)(*(long *)(_o + 8) + 8);
LAB_0038ac07:
      local_20 = &local_30;
      local_28.d = (QIconPrivate *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_28.d);
    }
    break;
  case ReadProperty:
    puVar1 = (undefined8 *)*_a;
    if (_id == 2) {
      *(undefined1 *)puVar1 = *(undefined1 *)(*(long *)(_o + 8) + 0xb8);
    }
    else if (_id == 1) {
      QIcon::QIcon(&local_30,(QIcon *)(*(long *)(_o + 8) + 0x88));
      QVar8.d = local_30.d;
      local_30.d = (QIconPrivate *)0x0;
      local_28.d = (QIconPrivate *)*puVar1;
      *puVar1 = QVar8.d;
      QIcon::~QIcon(&local_28);
      QIcon::~QIcon(&local_30);
    }
    else if (_id == 0) {
      lVar7 = *(long *)(_o + 8);
      piVar2 = *(int **)(lVar7 + 0x90);
      uVar3 = *(undefined8 *)(lVar7 + 0x98);
      uVar4 = *(undefined8 *)(lVar7 + 0xa0);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      pQVar5 = (QArrayData *)*puVar1;
      *puVar1 = piVar2;
      puVar1[1] = uVar3;
      puVar1[2] = uVar4;
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
            QArrayData::deallocate(pQVar5,2,0x10);
            return;
          }
          goto LAB_0038ac5d;
        }
      }
    }
    break;
  case WriteProperty:
    pQVar9 = (QIcon *)*_a;
    if (_id == 2) {
      visible = *(undefined1 *)&pQVar9->d;
      goto LAB_0038aac1;
    }
    if (_id == 1) {
      pQVar12 = *(QSystemTrayIconPrivate **)(_o + 8);
      QIcon::operator=(&pQVar12->icon,pQVar9);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QSystemTrayIconPrivate::updateIcon_sys(pQVar12);
        return;
      }
      goto LAB_0038ac5d;
    }
    if (_id == 0) {
      pQVar12 = *(QSystemTrayIconPrivate **)(_o + 8);
      QString::operator=(&pQVar12->toolTip,(QString *)pQVar9);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QSystemTrayIconPrivate::updateToolTip_sys(pQVar12);
        return;
      }
      goto LAB_0038ac5d;
    }
    break;
  case IndexOfMethod:
    pcVar6 = *_a[1];
    lVar7 = *(long *)((long)_a[1] + 8);
    if (pcVar6 == activated && lVar7 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar6 == messageClicked && lVar7 == 0) {
      *(undefined4 *)*_a = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0038ac5d:
  __stack_chk_fail();
}

Assistant:

void QSystemTrayIcon::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSystemTrayIcon *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QSystemTrayIcon::ActivationReason>>(_a[1]))); break;
        case 1: _t->messageClicked(); break;
        case 2: _t->setVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->show(); break;
        case 4: _t->hide(); break;
        case 5: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QIcon>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4]))); break;
        case 6: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QIcon>>(_a[3]))); break;
        case 7: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QSystemTrayIcon::MessageIcon>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4]))); break;
        case 8: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QSystemTrayIcon::MessageIcon>>(_a[3]))); break;
        case 9: _t->showMessage((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 10: _t->d_func()->_q_emitActivated((*reinterpret_cast< std::add_pointer_t<QPlatformSystemTrayIcon::ActivationReason>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSystemTrayIcon::*)(QSystemTrayIcon::ActivationReason )>(_a, &QSystemTrayIcon::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSystemTrayIcon::*)()>(_a, &QSystemTrayIcon::messageClicked, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->toolTip(); break;
        case 1: *reinterpret_cast<QIcon*>(_v) = _t->icon(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isVisible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setToolTip(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setIcon(*reinterpret_cast<QIcon*>(_v)); break;
        case 2: _t->setVisible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}